

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_decoder.cc
# Opt level: O0

void __thiscall
draco::PointAttributeVectorOutputIterator<float>::PointAttributeVectorOutputIterator
          (PointAttributeVectorOutputIterator<float> *this,
          vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
          *atts)

{
  __tuple_element_t<3UL,_tuple<PointAttribute_*,_unsigned_int,_DataType,_unsigned_int,_unsigned_int>_>
  _Var1;
  ulong uVar2;
  size_type sVar3;
  __tuple_element_t<3UL,_tuple<PointAttribute_*,_unsigned_int,_DataType,_unsigned_int,_unsigned_int>_>
  *p_Var4;
  __tuple_element_t<4UL,_tuple<PointAttribute_*,_unsigned_int,_DataType,_unsigned_int,_unsigned_int>_>
  *p_Var5;
  uint *puVar6;
  uchar *puVar7;
  vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
  *in_RSI;
  size_type in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  AttributeTuple *att;
  int index;
  uint32_t required_decode_bytes;
  size_type __new_size;
  uint local_34;
  reference local_30;
  int local_24;
  uint local_20 [2];
  vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
  *in_stack_ffffffffffffffe8;
  
  __new_size = in_RDI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1eec95);
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(__new_size + 0x20);
  std::
  vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
  ::vector(in_RSI,in_stack_ffffffffffffffe8);
  IndexType<unsigned_int,_draco::PointIndex_tag_type_>::IndexType
            ((IndexType<unsigned_int,_draco::PointIndex_tag_type_> *)(in_RDI + 0x38),0);
  local_20[0] = 0;
  local_24 = 0;
  while( true ) {
    uVar2 = (ulong)local_24;
    sVar3 = std::
            vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
            ::size((vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                    *)(in_RDI + 0x20));
    if (sVar3 <= uVar2) break;
    local_30 = std::
               vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
               ::operator[]((vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                             *)(in_RDI + 0x20),(long)local_24);
    p_Var4 = std::
             get<3ul,draco::PointAttribute*,unsigned_int,draco::DataType,unsigned_int,unsigned_int>
                       ((tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                         *)0x1eed1c);
    _Var1 = *p_Var4;
    p_Var5 = std::
             get<4ul,draco::PointAttribute*,unsigned_int,draco::DataType,unsigned_int,unsigned_int>
                       ((tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                         *)0x1eed2c);
    local_34 = _Var1 * *p_Var5;
    puVar6 = std::max<unsigned_int>(local_20,&local_34);
    local_20[0] = *puVar6;
    local_24 = local_24 + 1;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,__new_size);
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1eeda5);
  *(uchar **)(in_RDI + 0x18) = puVar7;
  return;
}

Assistant:

explicit PointAttributeVectorOutputIterator(
      const std::vector<AttributeTuple> &atts)
      : attributes_(atts), point_id_(0) {
    DRACO_DCHECK_GE(atts.size(), 1);
    uint32_t required_decode_bytes = 0;
    for (auto index = 0; index < attributes_.size(); index++) {
      const AttributeTuple &att = attributes_[index];
      required_decode_bytes = (std::max)(required_decode_bytes,
                                         std::get<3>(att) * std::get<4>(att));
    }
    memory_.resize(required_decode_bytes);
    data_ = memory_.data();
  }